

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::extractLaneUI8x16(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  undefined7 in_register_00000011;
  ulong uVar1;
  long lVar2;
  LaneArray<16> local_198;
  
  uVar1 = CONCAT71(in_register_00000011,index) & 0xffffffff;
  getLanes<unsigned_char,16>
            (&local_198,(wasm *)this,(Literal *)CONCAT71(in_register_00000011,index));
  if ((byte)uVar1 < 0x10) {
    Literal(__return_storage_ptr__,local_198._M_elems + uVar1);
    lVar2 = 0x168;
    do {
      ~Literal((Literal *)((long)&local_198._M_elems[0].field_0 + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar1,0x10);
}

Assistant:

Literal Literal::extractLaneUI8x16(uint8_t index) const {
  return getLanesUI8x16().at(index);
}